

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_verify_vector.cpp
# Opt level: O2

OperatorResultType
duckdb::VerifyEmitNestedShuffleVector(DataChunk *input,DataChunk *chunk,OperatorState *state)

{
  reference vector;
  idx_t c;
  ulong __n;
  
  DataChunk::Copy(input,chunk,0);
  for (__n = 0; __n < (ulong)(((long)(chunk->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(chunk->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    vector = vector<duckdb::Vector,_true>::get<true>(&chunk->data,__n);
    Vector::DebugShuffleNestedVector(vector,chunk->count);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType VerifyEmitNestedShuffleVector(const DataChunk &input, DataChunk &chunk, OperatorState &state) {
	input.Copy(chunk);
	for (idx_t c = 0; c < chunk.ColumnCount(); c++) {
		Vector::DebugShuffleNestedVector(chunk.data[c], chunk.size());
	}
	return OperatorResultType::NEED_MORE_INPUT;
}